

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O2

void __thiscall mau::ProxySession::postNextRead(ProxySession *this,uint8_t *readBuffer)

{
  basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar1;
  long lVar2;
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:646:9)>
  *this_00;
  ptr local_68;
  anon_class_16_2_48e8bdf1 local_50;
  mutable_buffers_1 local_40;
  
  (this->SourceAddress).impl_.data_.base.sa_family = 2;
  local_68.h = &local_50;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 2) = 0;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 10) = 0;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 0xc) = 0;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 0x14) = 0;
  local_40.super_mutable_buffer.data_ = readBuffer + 0x1c;
  local_40.super_mutable_buffer.size_ =
       (size_t)(this->super_DeliveryCommonData).ProxyConfig.MaxDatagramBytes;
  pbVar1 = (this->super_DeliveryCommonData).Socket._M_t.
           super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           .
           super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
           ._M_head_impl;
  lVar2 = *(long *)&(pbVar1->
                    super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                    ).super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>;
  local_50.this = this;
  local_50.readBuffer = readBuffer;
  this_00 = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:646:9)>
             *)asio::asio_handler_allocate(0x70,local_68.h);
  local_68.v = this_00;
  asio::detail::
  reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ::reactive_socket_recvfrom_op_base
            ((reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
              *)this_00,
             (((implementation_type *)
              ((long)&(pbVar1->
                      super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                      ).super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> +
              8))->super_base_implementation_type).socket_,2,&local_40,&this->SourceAddress,0,
             asio::detail::
             reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:646:9)>
             ::do_complete);
  (this_00->handler_).this = local_50.this;
  (this_00->handler_).readBuffer = local_50.readBuffer;
  local_68.p = this_00;
  asio::detail::reactive_socket_service_base::start_op
            ((reactive_socket_service_base *)(lVar2 + 0x28),
             (base_implementation_type *)
             ((long)&(pbVar1->
                     super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                     ).super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> + 8
             ),0,(reactor_op *)this_00,false,true,false);
  local_68.v = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:646:9)>
                *)0x0;
  local_68.p = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:646:9)>
                *)0x0;
  asio::detail::
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:646:9)>
  ::ptr::~ptr(&local_68);
  return;
}

Assistant:

void ProxySession::postNextRead(uint8_t* readBuffer)
{
    // Clear source address to allow us to check if it's filled later
    // during error handling
    SourceAddress = UDPAddress();

    // Dispatch asynchronous recvfrom()
    Socket->async_receive_from(
        asio::buffer(readBuffer + kQueueHeaderSize, ProxyConfig.MaxDatagramBytes),
        SourceAddress,
        [this, readBuffer](const asio::error_code& error, size_t bytes_transferred)
    {
        uint8_t* nextReadBuffer = readBuffer;

        // If there was an error reported:
        if (error)
        {
            std::string fromStr = "unrecognized";

            // If no source address was provided:
            if (SourceAddress.address().is_unspecified())
            {
                Logger.Warning("Socket broken based on recvfrom with no source address: ", error.message());
                LastResult = Mau_NetworkFailed;
                return; // Stop here
            }

            // Otherwise we assume it is due to ICMP message from a peer:

            if (SourceAddress == ClientAddress.Get())
            {
                Logger.Debug("recvfrom failed (ICMP from client): ", error.message());
                ClientAddress.Set(UDPAddress());
            }
            else if (SourceAddress == ServerAddress.Get())
            {
                Logger.Debug("recvfrom failed (ICMP from server): ", error.message());
                ClientAddress.Set(UDPAddress());
            }
            else {
                Logger.Debug("recvfrom failed (ICMP unrecognized source): ", error.message());
            }

            // Otherwise we assume it is due to ICMP message from a peer.
            // Fall-thru to continue reading datagrams
        }
        else if (bytes_transferred <= 0)
        {
            Logger.Warning("Socket closed");
            LastResult = Mau_NetworkFailed;
            return; // Stop here
        }
        else if (!Terminated)
        {
            MAU_DEBUG_ASSERT(bytes_transferred <= ProxyConfig.MaxDatagramBytes);

            QueueNode* queueNode = reinterpret_cast<QueueNode*>(readBuffer);
            queueNode->Bytes = static_cast<unsigned>(bytes_transferred);

            if (SourceAddress == ServerAddress.Get())
            {
                S2C.InsertQueueNode(queueNode);
                nextReadBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + ProxyConfig.MaxDatagramBytes);
            }
            else
            {
                const UDPAddress clientAddress = ClientAddress.Get();

                if (clientAddress.address().is_unspecified())
                {
                    ClientAddress.Set(SourceAddress);
                    S2C.SetDeliveryAddress(SourceAddress);

                    C2S.InsertQueueNode(queueNode);
                    nextReadBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + ProxyConfig.MaxDatagramBytes);

                    Logger.Info("Set client address to ", SourceAddress.address().to_string(), " : ", SourceAddress.port());
                }
                else if (SourceAddress == clientAddress)
                {
                    C2S.InsertQueueNode(queueNode);
                    nextReadBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + ProxyConfig.MaxDatagramBytes);
                }
                else {
                    Logger.Warning("Ignored data from unrecognized source address ", SourceAddress.address().to_string(), " : ", SourceAddress.port());
                }
            }
        }

        // Post next read buffer
        postNextRead(nextReadBuffer);
    });
}